

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

df_solver_t * __thiscall
tchecker::clockbounds::df_solver_t::operator=(df_solver_t *this,df_solver_t *solver)

{
  df_solver_t *solver_local;
  df_solver_t *this_local;
  
  if (this != solver) {
    this->_loc_number = solver->_loc_number;
    this->_clock_number = solver->_clock_number;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_loc_pid,&solver->_loc_pid);
    this->_dim = solver->_dim;
    this->_L = solver->_L;
    this->_U = solver->_U;
    this->_updated_L = (bool)(solver->_updated_L & 1);
    this->_updated_U = (bool)(solver->_updated_U & 1);
    solver->_loc_number = 0;
    solver->_clock_number = 0;
    solver->_dim = 1;
    solver->_L = (db_t *)0x0;
    solver->_U = (db_t *)0x0;
    solver->_updated_L = false;
    solver->_updated_U = false;
  }
  return this;
}

Assistant:

tchecker::clockbounds::df_solver_t & df_solver_t::operator=(tchecker::clockbounds::df_solver_t && solver)
{
  if (this != &solver) {
    _loc_number = std::move(solver._loc_number);
    _clock_number = std::move(solver._clock_number);
    _loc_pid = std::move(solver._loc_pid);
    _dim = std::move(solver._dim);
    _L = std::move(solver._L);
    _U = std::move(solver._U);
    _updated_L = std::move(solver._updated_L);
    _updated_U = std::move(solver._updated_U);

    solver._loc_number = 0;
    solver._clock_number = 0;
    solver._dim = 1;
    solver._L = nullptr;
    solver._U = nullptr;
    solver._updated_L = false;
    solver._updated_U = false;
  }

  return *this;
}